

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::AltNode::Emit(AltNode *this,Compiler *compiler,CharCount *skipped)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  RuntimeCharTrie *pRVar3;
  CharSet<char16_t> *pCVar4;
  Node *pNVar5;
  code *pcVar6;
  RuntimeCharTrieEntry *pRVar7;
  bool bVar8;
  char16 cVar9;
  BOOL BVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  AltNode *curr;
  undefined4 *puVar14;
  AltNode *pAVar15;
  uint8 *puVar16;
  RuntimeCharSet<char16_t> *this_00;
  Compiler *pCVar17;
  uint uVar18;
  AltNode *curr_1;
  size_t sVar19;
  AltNode *curr_3;
  CharSetNode *pCVar20;
  uint8 *puVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  CharCount CVar26;
  bool bVar27;
  ulong local_78;
  Char local_60 [4];
  CharCount itemSkipped;
  undefined4 uStack_54;
  uint8 **local_50;
  CharSetNode *local_48;
  AltNode *local_40;
  Compiler *local_38;
  undefined7 extraout_var;
  
  local_40 = this;
  local_38 = compiler;
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xa42,"(skipped == 0)","skipped == 0");
    if (!bVar8) goto LAB_00eb18ac;
    *puVar14 = 0;
  }
  pCVar17 = local_38;
  switch(local_40->scheme) {
  case Try:
    if (local_40->isOptional == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa53,"(!isOptional)","!isOptional");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    uVar18 = 0xffffffff;
    pAVar15 = local_40;
    do {
      pAVar15 = pAVar15->tail;
      uVar18 = uVar18 + 1;
    } while (pAVar15 != (AltNode *)0x0);
    if (0x7ffffffe < uVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa57,"(numItems >= 1)","numItems >= 1");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    if (uVar18 == 0) {
      _itemSkipped = &DAT_00000008;
    }
    else {
      pAVar2 = &local_38->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        sVar19 = (long)(int)uVar18 << 2;
      }
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
      }
      _itemSkipped = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(pAVar2,sVar19);
      if (_itemSkipped == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
      }
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_48 = (CharSetNode *)&CharSetFull::Instance;
    local_50 = &local_38->instBuf;
    uVar12 = 0;
    iVar24 = 0;
    do {
      if (0 < iVar24) {
        uVar1 = local_38->instNext;
        if (uVar1 <= uVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
        }
        if (local_38->instNext < uVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x279,"(label <= instNext)","label <= instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
        }
        *(uint *)(local_38->instBuf + uVar12) = uVar1;
      }
      local_60[0] = L'\0';
      local_60[1] = L'\0';
      pCVar17 = local_38;
      if (iVar24 < (int)uVar18) {
        pNVar5 = local_40->head;
        pCVar4 = pNVar5->firstSet;
        if ((pCVar4 == (CharSet<char16_t> *)0x0) || ((pNVar5->thisConsumes).lower == 0)) {
LAB_00eb0010:
          puVar21 = Compiler::Emit(local_38,5);
          *puVar21 = ']';
          puVar21[1] = 0xff;
          puVar21[2] = 0xff;
          puVar21[3] = 0xff;
          puVar21[4] = 0xff;
          puVar21 = puVar21 + 1;
          puVar16 = local_38->instBuf;
          pCVar17 = local_38;
          if (puVar21 < puVar16) {
LAB_00eb0045:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
            pCVar17 = local_38;
          }
          else {
LAB_00eb003a:
            if (puVar16 + pCVar17->instNext <= puVar21) goto LAB_00eb0045;
          }
          uVar12 = (int)puVar21 - *(int *)&pCVar17->instBuf;
        }
        else {
          if ((pNVar5->field_0xc & 1) == 0) {
            sVar19 = (pCVar4->rep).compact.countPlusOne;
            if (sVar19 - 1 < 5) {
              uVar12 = (int)sVar19 - 1;
            }
            else {
              pCVar20 = (pCVar4->rep).full.root;
              if (pCVar20 == (CharSetNode *)0x0) {
                uVar12 = CharBitvec::Count(&(pCVar4->rep).full.direct);
              }
              else {
                if ((pCVar20 != local_48) &&
                   (uVar12 = (*pCVar20->_vptr_CharSetNode[0xb])(pCVar20,2), 0xff00 < uVar12)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                     ,0x252,
                                     "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                     ,
                                     "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                    );
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                }
                uVar13 = CharBitvec::Count(&(pCVar4->rep).full.direct);
                pCVar20 = (pCVar4->rep).full.root;
                if (pCVar20 == local_48) {
                  iVar11 = 0xff00;
                }
                else {
                  iVar11 = (*pCVar20->_vptr_CharSetNode[0xb])(pCVar20,2);
                }
                uVar12 = iVar11 + uVar13;
              }
            }
            if (0x14 < uVar12) goto LAB_00eb0010;
          }
          pAVar15 = local_40;
          iVar11 = (*local_40->head->_vptr_Node[0xb])(local_40->head,local_38);
          pCVar17 = local_38;
          sVar19 = (pAVar15->head->firstSet->rep).compact.countPlusOne;
          if ((char)iVar11 == '\0') {
            if (sVar19 == 2) {
              puVar21 = Compiler::Emit(local_38,7);
              cVar9 = CharSet<char16_t>::Singleton(local_40->head->firstSet);
              *puVar21 = '^';
              *(char16 *)(puVar21 + 1) = cVar9;
              puVar21[3] = 0xff;
              puVar21[4] = 0xff;
              puVar21[5] = 0xff;
              puVar21[6] = 0xff;
              puVar21 = puVar21 + 3;
            }
            else {
              puVar16 = Compiler::Emit(local_38,0x2d);
              *puVar16 = '`';
              RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar16 + 1));
              puVar16[0x29] = 0xff;
              puVar16[0x2a] = 0xff;
              puVar16[0x2b] = 0xff;
              puVar16[0x2c] = 0xff;
              puVar21 = puVar16 + 0x29;
              RuntimeCharSet<char16_t>::CloneFrom
                        ((RuntimeCharSet<char16_t> *)(puVar16 + 1),pCVar17->rtAllocator,
                         local_40->head->firstSet);
            }
            puVar16 = pCVar17->instBuf;
            if (puVar16 <= puVar21) goto LAB_00eb003a;
            goto LAB_00eb0045;
          }
          if (sVar19 == 2) {
            puVar16 = Compiler::Emit(local_38,7);
            cVar9 = CharSet<char16_t>::Singleton(local_40->head->firstSet);
            *puVar16 = '_';
            *(char16 *)(puVar16 + 1) = cVar9;
            puVar16[3] = 0xff;
            puVar16[4] = 0xff;
            puVar16[5] = 0xff;
            puVar16[6] = 0xff;
            puVar16 = puVar16 + 3;
          }
          else {
            puVar21 = Compiler::Emit(local_38,0x2d);
            *puVar21 = 'a';
            RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar21 + 1));
            puVar21[0x29] = 0xff;
            puVar21[0x2a] = 0xff;
            puVar21[0x2b] = 0xff;
            puVar21[0x2c] = 0xff;
            puVar16 = puVar21 + 0x29;
            RuntimeCharSet<char16_t>::CloneFrom
                      ((RuntimeCharSet<char16_t> *)(puVar21 + 1),pCVar17->rtAllocator,
                       local_40->head->firstSet);
          }
          if ((puVar16 < pCVar17->instBuf) || (pCVar17->instBuf + pCVar17->instNext <= puVar16)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
            pCVar17 = local_38;
          }
          uVar12 = (int)puVar16 - *(int *)local_50;
          local_60[0] = L'\x01';
          local_60[1] = L'\0';
        }
      }
      (*local_40->head->_vptr_Node[0x11])(local_40->head,pCVar17,local_60);
      if (iVar24 < (int)uVar18) {
        puVar16 = Compiler::Emit(local_38,5);
        *puVar16 = '\x03';
        puVar16[1] = 0xff;
        puVar16[2] = 0xff;
        puVar16[3] = 0xff;
        puVar16[4] = 0xff;
        puVar16 = puVar16 + 1;
        if ((puVar16 < local_38->instBuf) || (local_38->instBuf + local_38->instNext <= puVar16)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x272,
                             "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                             "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
        }
        *(int *)(_itemSkipped + (long)iVar24 * 4) = (int)puVar16 - *(int *)&local_38->instBuf;
      }
      local_40 = local_40->tail;
      iVar24 = iVar24 + 1;
    } while (local_40 != (AltNode *)0x0);
    if (0 < (int)uVar18) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar25 = 0;
      pCVar17 = local_38;
      do {
        uVar12 = *(uint *)(_itemSkipped + uVar25 * 4);
        uVar1 = pCVar17->instNext;
        if (uVar1 <= uVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        if (pCVar17->instNext < uVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x279,"(label <= instNext)","label <= instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        *(uint *)(pCVar17->instBuf + uVar12) = uVar1;
        uVar25 = uVar25 + 1;
      } while (uVar18 != uVar25);
    }
    break;
  case None:
    if (local_40->isOptional == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xa91,"(isOptional)","isOptional");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    break;
  case Trie:
    pRVar3 = local_40->runtimeTrie;
    puVar16 = Compiler::Emit(local_38,0x11);
    *puVar16 = '\"';
    puVar16[1] = '\0';
    puVar16[2] = '\0';
    puVar16[3] = '\0';
    puVar16[4] = '\0';
    puVar16[9] = '\0';
    puVar16[10] = '\0';
    puVar16[0xb] = '\0';
    puVar16[0xc] = '\0';
    puVar16[0xd] = '\0';
    puVar16[0xe] = '\0';
    puVar16[0xf] = '\0';
    puVar16[0x10] = '\0';
    pRVar7 = pRVar3->children;
    *(undefined8 *)(puVar16 + 1) = *(undefined8 *)pRVar3;
    *(RuntimeCharTrieEntry **)(puVar16 + 9) = pRVar7;
    break;
  case Switch:
    pAVar15 = local_40;
    if (0x18 < local_40->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xaae,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      pAVar15 = (AltNode *)CONCAT71(extraout_var,bVar8);
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    _itemSkipped = (char *)CONCAT44(uStack_54,(int)CONCAT71((int7)((ulong)pAVar15 >> 8),1));
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    iVar24 = 0;
    pCVar17 = local_38;
    pAVar15 = local_40;
    do {
      pNVar5 = pAVar15->head;
      if ((pNVar5->thisConsumes).lower == 0) {
        if (local_40->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xab5,"(isOptional)","isOptional");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
      }
      else {
        iVar24 = iVar24 + 1;
        iVar11 = (*pNVar5->_vptr_Node[0xb])(pNVar5,pCVar17);
        uVar18 = itemSkipped & 0xff;
        if ((char)iVar11 == '\0') {
          uVar18 = 0;
        }
        _itemSkipped = (char *)CONCAT44(uStack_54,uVar18);
        pCVar17 = local_38;
      }
      pAVar15 = pAVar15->tail;
    } while (pAVar15 != (AltNode *)0x0);
    if (iVar24 < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac0,"(numItems > 1)","numItems > 1");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
      pCVar17 = local_38;
    }
    local_50 = (uint8 **)&DAT_00000008;
    local_48 = (CharSetNode *)&DAT_00000008;
    uVar18 = iVar24 - 1;
    if (uVar18 != 0) {
      pAVar2 = &pCVar17->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        sVar19 = (long)(int)uVar18 * 4;
      }
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
      }
      local_48 = (CharSetNode *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar2,sVar19);
      pCVar17 = local_38;
      if (local_48 == (CharSetNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
    }
    if (iVar24 != 0) {
      pAVar2 = &pCVar17->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < iVar24) {
        sVar19 = (long)iVar24 << 2;
      }
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
      }
      local_50 = (uint8 **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar2,sVar19);
      pCVar17 = local_38;
      if (local_50 == (uint8 **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
    }
    uVar25 = (ulong)pCVar17->instNext;
    if (0x18 < local_40->switchSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xac9,"(switchSize <= Switch24Inst::MaxCases)",
                         "switchSize <= Switch24Inst::MaxCases");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
      pCVar17 = local_38;
    }
    iVar24 = local_40->switchSize;
    if (((ulong)_itemSkipped & 1) == 0) {
      if (iVar24 < 3) {
        puVar16 = Compiler::Emit(pCVar17,0xe);
        puVar16[0] = '\b';
        puVar16[1] = '\0';
        goto LAB_00eb0c02;
      }
      if (iVar24 < 5) {
        puVar16 = Compiler::Emit(pCVar17,0x1a);
        puVar16[0] = '\t';
        puVar16[1] = '\0';
        goto LAB_00eb0c46;
      }
      if (iVar24 < 9) {
        puVar16 = Compiler::Emit(pCVar17,0x32);
        puVar16[0] = '\n';
        puVar16[1] = '\0';
        goto LAB_00eb0c8c;
      }
      if (iVar24 < 0x11) {
        puVar16 = Compiler::Emit(pCVar17,0x62);
        puVar16[0] = '\v';
        puVar16[1] = '\0';
        goto LAB_00eb0cd4;
      }
      if (iVar24 < 0x19) {
        puVar16 = Compiler::Emit(pCVar17,0x92);
        puVar16[0] = '\f';
        puVar16[1] = '\0';
        goto LAB_00eb0d2b;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      uVar13 = 0xafd;
LAB_00eb0dc7:
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,uVar13,"(false)",
                         "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases."
                        );
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    else if (iVar24 < 3) {
      puVar16 = Compiler::Emit(pCVar17,0xe);
      puVar16[0] = '\r';
      puVar16[1] = '\0';
LAB_00eb0c02:
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16[5] = 0xff;
      puVar16[6] = 0xff;
      puVar16[7] = 0xff;
      puVar16[8] = 0xff;
      puVar16[9] = 0xff;
      puVar16[10] = 0xff;
      puVar16[0xb] = 0xff;
      puVar16[0xc] = 0xff;
      puVar16[0xd] = 0xff;
    }
    else if (iVar24 < 5) {
      puVar16 = Compiler::Emit(pCVar17,0x1a);
      puVar16[0] = '\x0e';
      puVar16[1] = '\0';
LAB_00eb0c46:
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16[5] = 0xff;
      puVar16[6] = 0xff;
      puVar16[7] = 0xff;
      puVar16[8] = 0xff;
      puVar16[9] = 0xff;
      puVar16[10] = 0xff;
      puVar16[0xb] = 0xff;
      puVar16[0xc] = 0xff;
      puVar16[0xd] = 0xff;
      puVar16[0xe] = 0xff;
      puVar16[0xf] = 0xff;
      puVar16[0x10] = 0xff;
      puVar16[0x11] = 0xff;
      puVar16[0x12] = 0xff;
      puVar16[0x13] = 0xff;
      puVar16[0x14] = 0xff;
      puVar16[0x15] = 0xff;
      puVar16[0x16] = 0xff;
      puVar16[0x17] = 0xff;
      puVar16[0x18] = 0xff;
      puVar16[0x19] = 0xff;
    }
    else if (iVar24 < 9) {
      puVar16 = Compiler::Emit(pCVar17,0x32);
      puVar16[0] = '\x0f';
      puVar16[1] = '\0';
LAB_00eb0c8c:
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16[5] = 0xff;
      puVar16[6] = 0xff;
      puVar16[7] = 0xff;
      puVar16[8] = 0xff;
      puVar16[9] = 0xff;
      puVar16[10] = 0xff;
      puVar16[0xb] = 0xff;
      puVar16[0xc] = 0xff;
      puVar16[0xd] = 0xff;
      puVar16[0xe] = 0xff;
      puVar16[0xf] = 0xff;
      puVar16[0x10] = 0xff;
      puVar16[0x11] = 0xff;
      puVar16[0x12] = 0xff;
      puVar16[0x13] = 0xff;
      puVar16[0x14] = 0xff;
      puVar16[0x15] = 0xff;
      puVar16[0x16] = 0xff;
      puVar16[0x17] = 0xff;
      puVar16[0x18] = 0xff;
      puVar16[0x19] = 0xff;
      puVar16[0x1a] = 0xff;
      puVar16[0x1b] = 0xff;
      puVar16[0x1c] = 0xff;
      puVar16[0x1d] = 0xff;
      puVar16[0x1e] = 0xff;
      puVar16[0x1f] = 0xff;
      puVar16[0x20] = 0xff;
      puVar16[0x21] = 0xff;
      puVar16[0x22] = 0xff;
      puVar16[0x23] = 0xff;
      puVar16[0x24] = 0xff;
      puVar16[0x25] = 0xff;
      puVar16[0x26] = 0xff;
      puVar16[0x27] = 0xff;
      puVar16[0x28] = 0xff;
      puVar16[0x29] = 0xff;
      puVar16[0x2a] = 0xff;
      puVar16[0x2b] = 0xff;
      puVar16[0x2c] = 0xff;
      puVar16[0x2d] = 0xff;
      puVar16[0x2e] = 0xff;
      puVar16[0x2f] = 0xff;
      puVar16[0x30] = 0xff;
      puVar16[0x31] = 0xff;
    }
    else if (iVar24 < 0x11) {
      puVar16 = Compiler::Emit(pCVar17,0x62);
      puVar16[0] = '\x10';
      puVar16[1] = '\0';
LAB_00eb0cd4:
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16[5] = 0xff;
      puVar16[6] = 0xff;
      puVar16[7] = 0xff;
      puVar16[8] = 0xff;
      puVar16[9] = 0xff;
      puVar16[10] = 0xff;
      puVar16[0xb] = 0xff;
      puVar16[0xc] = 0xff;
      puVar16[0xd] = 0xff;
      puVar16[0xe] = 0xff;
      puVar16[0xf] = 0xff;
      puVar16[0x10] = 0xff;
      puVar16[0x11] = 0xff;
      puVar16[0x12] = 0xff;
      puVar16[0x13] = 0xff;
      puVar16[0x14] = 0xff;
      puVar16[0x15] = 0xff;
      puVar16[0x16] = 0xff;
      puVar16[0x17] = 0xff;
      puVar16[0x18] = 0xff;
      puVar16[0x19] = 0xff;
      puVar16[0x1a] = 0xff;
      puVar16[0x1b] = 0xff;
      puVar16[0x1c] = 0xff;
      puVar16[0x1d] = 0xff;
      puVar16[0x1e] = 0xff;
      puVar16[0x1f] = 0xff;
      puVar16[0x20] = 0xff;
      puVar16[0x21] = 0xff;
      puVar16[0x22] = 0xff;
      puVar16[0x23] = 0xff;
      puVar16[0x24] = 0xff;
      puVar16[0x25] = 0xff;
      puVar16[0x26] = 0xff;
      puVar16[0x27] = 0xff;
      puVar16[0x28] = 0xff;
      puVar16[0x29] = 0xff;
      puVar16[0x2a] = 0xff;
      puVar16[0x2b] = 0xff;
      puVar16[0x2c] = 0xff;
      puVar16[0x2d] = 0xff;
      puVar16[0x2e] = 0xff;
      puVar16[0x2f] = 0xff;
      puVar16[0x30] = 0xff;
      puVar16[0x31] = 0xff;
      puVar16[0x32] = 0xff;
      puVar16[0x33] = 0xff;
      puVar16[0x34] = 0xff;
      puVar16[0x35] = 0xff;
      puVar16[0x36] = 0xff;
      puVar16[0x37] = 0xff;
      puVar16[0x38] = 0xff;
      puVar16[0x39] = 0xff;
      puVar16[0x3a] = 0xff;
      puVar16[0x3b] = 0xff;
      puVar16[0x3c] = 0xff;
      puVar16[0x3d] = 0xff;
      puVar16[0x3e] = 0xff;
      puVar16[0x3f] = 0xff;
      puVar16[0x40] = 0xff;
      puVar16[0x41] = 0xff;
      puVar16[0x42] = 0xff;
      puVar16[0x43] = 0xff;
      puVar16[0x44] = 0xff;
      puVar16[0x45] = 0xff;
      puVar16[0x46] = 0xff;
      puVar16[0x47] = 0xff;
      puVar16[0x48] = 0xff;
      puVar16[0x49] = 0xff;
      puVar16[0x4a] = 0xff;
      puVar16[0x4b] = 0xff;
      puVar16[0x4c] = 0xff;
      puVar16[0x4d] = 0xff;
      puVar16[0x4e] = 0xff;
      puVar16[0x4f] = 0xff;
      puVar16[0x50] = 0xff;
      puVar16[0x51] = 0xff;
      puVar16[0x52] = 0xff;
      puVar16[0x53] = 0xff;
      puVar16[0x54] = 0xff;
      puVar16[0x55] = 0xff;
      puVar16[0x56] = 0xff;
      puVar16[0x57] = 0xff;
      puVar16[0x58] = 0xff;
      puVar16[0x59] = 0xff;
      puVar16[0x5a] = 0xff;
      puVar16[0x5b] = 0xff;
      puVar16[0x5c] = 0xff;
      puVar16[0x5d] = 0xff;
      puVar16[0x5e] = 0xff;
      puVar16[0x5f] = 0xff;
      puVar16[0x60] = 0xff;
      puVar16[0x61] = 0xff;
    }
    else {
      if (0x18 < iVar24) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        uVar13 = 0xae2;
        goto LAB_00eb0dc7;
      }
      puVar16 = Compiler::Emit(pCVar17,0x92);
      puVar16[0] = '\x11';
      puVar16[1] = '\0';
LAB_00eb0d2b:
      memset(puVar16 + 2,0xff,0x90);
    }
    pCVar17 = local_38;
    if (local_40->isOptional == true) {
      puVar16 = Compiler::Emit(local_38,5);
      *puVar16 = '\x03';
      puVar16[1] = 0xff;
      puVar16[2] = 0xff;
      puVar16[3] = 0xff;
      puVar16[4] = 0xff;
      puVar16 = puVar16 + 1;
      if ((puVar16 < pCVar17->instBuf) || (pCVar17->instBuf + pCVar17->instNext <= puVar16)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x272,
                           "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                           "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
      local_78 = (ulong)(uint)((int)puVar16 - *(int *)&pCVar17->instBuf);
    }
    else {
      puVar16 = Compiler::Emit(local_38,1);
      *puVar16 = '\x01';
      local_78 = 0;
    }
    iVar24 = 0;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pCVar17 = local_38;
    pAVar15 = local_40;
    do {
      pNVar5 = pAVar15->head;
      if ((pNVar5->thisConsumes).lower != 0) {
        if (((ulong)_itemSkipped & 1) != 0) {
          *skipped = 1;
        }
        *(CharCount *)((long)local_50 + (long)iVar24 * 4) = pCVar17->instNext;
        (*pNVar5->_vptr_Node[0x11])(pNVar5,pCVar17,skipped);
        if (iVar24 < (int)uVar18) {
          puVar16 = Compiler::Emit(local_38,5);
          *puVar16 = '\x03';
          puVar16[1] = 0xff;
          puVar16[2] = 0xff;
          puVar16[3] = 0xff;
          puVar16[4] = 0xff;
          puVar16 = puVar16 + 1;
          if ((puVar16 < local_38->instBuf) || (local_38->instBuf + local_38->instNext <= puVar16))
          {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
          }
          *(int *)((long)&local_48->_vptr_CharSetNode + (long)iVar24 * 4) =
               (int)puVar16 - *(int *)&local_38->instBuf;
        }
        iVar24 = iVar24 + 1;
        pCVar17 = local_38;
      }
      pAVar15 = pAVar15->tail;
    } while (pAVar15 != (AltNode *)0x0);
    if (local_40->isOptional != false) {
      uVar12 = pCVar17->instNext;
      if (uVar12 <= (uint)local_78) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x278,"(fixup < instNext)","fixup < instNext");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
      if (pCVar17->instNext < uVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x279,"(label <= instNext)","label <= instNext");
        if (!bVar8) {
LAB_00eb18ac:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
        pCVar17 = local_38;
      }
      *(uint *)(pCVar17->instBuf + local_78) = uVar12;
    }
    if (0 < (int)uVar18) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar22 = 0;
      pCVar17 = local_38;
      do {
        uVar12 = *(uint *)((long)&local_48->_vptr_CharSetNode + uVar22 * 4);
        uVar1 = pCVar17->instNext;
        if (uVar1 <= uVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        if (pCVar17->instNext < uVar1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x279,"(label <= instNext)","label <= instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        *(uint *)(pCVar17->instBuf + uVar12) = uVar1;
        uVar22 = uVar22 + 1;
      } while (uVar18 != uVar22);
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_48 = (CharSetNode *)(uVar25 + 0xe);
    iVar24 = 0;
    pAVar15 = local_40;
    do {
      if ((pAVar15->head->thisConsumes).lower != 0) {
        uVar18 = CharSet<char16_t>::GetCompactEntries(pAVar15->head->firstSet,4,local_60);
        if ((int)uVar18 < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb33,"(count > 0)","count > 0");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
        }
        if (0 < (int)uVar18) {
          lVar23 = (long)iVar24;
          uVar22 = 0;
          pCVar17 = local_38;
          do {
            iVar11 = local_40->switchSize;
            if (((ulong)_itemSkipped & 1) == 0) {
              if (iVar11 < 3) {
                if ((CharSetNode *)(ulong)pCVar17->instNext < local_48) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                  pCVar17 = local_38;
                }
                if (pCVar17->instBuf[uVar25] != '\b') goto LAB_00eb131a;
                goto LAB_00eb1363;
              }
              if (iVar11 < 5) {
                if ((ulong)pCVar17->instNext < uVar25 + 0x1a) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                  pCVar17 = local_38;
                }
                if (pCVar17->instBuf[uVar25] != '\t') goto LAB_00eb1456;
                goto LAB_00eb149f;
              }
              if (iVar11 < 9) {
                if ((ulong)pCVar17->instNext < uVar25 + 0x32) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                  pCVar17 = local_38;
                }
                if (pCVar17->instBuf[uVar25] != '\n') goto LAB_00eb1592;
                goto LAB_00eb15db;
              }
              if (iVar11 < 0x11) {
                if ((ulong)pCVar17->instNext < uVar25 + 0x62) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                  pCVar17 = local_38;
                }
                if (pCVar17->instBuf[uVar25] != '\v') goto LAB_00eb16ce;
                goto LAB_00eb1717;
              }
              if (iVar11 < 0x19) {
                if ((ulong)pCVar17->instNext < uVar25 + 0x92) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar14 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                     ,0x285,"(label + sizeof(T) <= instNext)",
                                     "label + sizeof(T) <= instNext");
                  if (!bVar8) goto LAB_00eb18ac;
                  *puVar14 = 0;
                  pCVar17 = local_38;
                }
                if (pCVar17->instBuf[uVar25] != '\f') goto LAB_00eb1810;
                goto LAB_00eb1855;
              }
            }
            else if (iVar11 < 3) {
              if ((CharSetNode *)(ulong)pCVar17->instNext < local_48) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              if (pCVar17->instBuf[uVar25] != '\r') {
LAB_00eb131a:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
LAB_00eb1363:
              SwitchMixin<(unsigned_char)'\x02'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x02_> *)(pCVar17->instBuf + uVar25 + 1),
                         local_60[uVar22],*(Label *)((long)local_50 + lVar23 * 4));
              pCVar17 = local_38;
            }
            else if (iVar11 < 5) {
              if ((ulong)pCVar17->instNext < uVar25 + 0x1a) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              if (pCVar17->instBuf[uVar25] != '\x0e') {
LAB_00eb1456:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
LAB_00eb149f:
              SwitchMixin<(unsigned_char)'\x04'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x04_> *)(pCVar17->instBuf + uVar25 + 1),
                         local_60[uVar22],*(Label *)((long)local_50 + lVar23 * 4));
              pCVar17 = local_38;
            }
            else if (iVar11 < 9) {
              if ((ulong)pCVar17->instNext < uVar25 + 0x32) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              if (pCVar17->instBuf[uVar25] != '\x0f') {
LAB_00eb1592:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
LAB_00eb15db:
              SwitchMixin<(unsigned_char)'\b'>::AddCase
                        ((SwitchMixin<(unsigned_char)__b_> *)(pCVar17->instBuf + uVar25 + 1),
                         local_60[uVar22],*(Label *)((long)local_50 + lVar23 * 4));
              pCVar17 = local_38;
            }
            else if (iVar11 < 0x11) {
              if ((ulong)pCVar17->instNext < uVar25 + 0x62) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              if (pCVar17->instBuf[uVar25] != '\x10') {
LAB_00eb16ce:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
LAB_00eb1717:
              SwitchMixin<(unsigned_char)'\x10'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x10_> *)(pCVar17->instBuf + uVar25 + 1),
                         local_60[uVar22],*(Label *)((long)local_50 + lVar23 * 4));
              pCVar17 = local_38;
            }
            else if (iVar11 < 0x19) {
              if ((ulong)pCVar17->instNext < uVar25 + 0x92) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x285,"(label + sizeof(T) <= instNext)",
                                   "label + sizeof(T) <= instNext");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              if (pCVar17->instBuf[uVar25] != '\x11') {
LAB_00eb1810:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x286,"(((Inst*)(instBuf + label))->tag == tag)",
                                   "((Inst*)(instBuf + label))->tag == tag");
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
LAB_00eb1855:
              SwitchMixin<(unsigned_char)'\x18'>::AddCase
                        ((SwitchMixin<(unsigned_char)__x18_> *)(pCVar17->instBuf + uVar25 + 1),
                         local_60[uVar22],*(Label *)((long)local_50 + lVar23 * 4));
              pCVar17 = local_38;
            }
            uVar22 = uVar22 + 1;
          } while (uVar18 != uVar22);
        }
        iVar24 = iVar24 + 1;
      }
      pAVar15 = pAVar15->tail;
    } while (pAVar15 != (AltNode *)0x0);
    break;
  case Chain:
    iVar24 = 0;
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pAVar15 = local_40;
    do {
      if ((pAVar15->head->thisConsumes).lower == 0) {
        if (local_40->isOptional == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0xb7f,"(isOptional)","isOptional");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
        }
      }
      else {
        iVar24 = iVar24 + 1;
      }
      pAVar15 = pAVar15->tail;
    } while (pAVar15 != (AltNode *)0x0);
    if (iVar24 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xb84,"(numItems > 0)","numItems > 0");
      if (!bVar8) goto LAB_00eb18ac;
      *puVar14 = 0;
    }
    CVar26 = iVar24 - 1;
    _itemSkipped = (char *)CONCAT44(uStack_54,CVar26);
    if (CVar26 == 0) {
      local_50 = (uint8 **)&DAT_00000008;
    }
    else {
      pAVar2 = &local_38->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)CVar26) {
        sVar19 = (long)(int)CVar26 * 4;
      }
      BVar10 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        CVar26 = itemSkipped;
      }
      local_50 = (uint8 **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(pAVar2,sVar19);
      if (local_50 == (uint8 **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        CVar26 = itemSkipped;
      }
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    iVar24 = 0;
    pCVar20 = (CharSetNode *)0x0;
    pCVar17 = local_38;
    pAVar15 = local_40;
    do {
      if ((pAVar15->head->thisConsumes).lower != 0) {
        if (0 < iVar24) {
          uVar18 = pCVar17->instNext;
          if (uVar18 <= (uint)pCVar20) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x278,"(fixup < instNext)","fixup < instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
            pCVar17 = local_38;
          }
          if (pCVar17->instNext < uVar18) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x279,"(label <= instNext)","label <= instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
            pCVar17 = local_38;
          }
          *(uint *)(pCVar17->instBuf + ((ulong)pCVar20 & 0xffffffff)) = uVar18;
          CVar26 = itemSkipped;
        }
        local_60[0] = L'\0';
        local_60[1] = L'\0';
        if ((iVar24 < (int)CVar26) || (local_40->isOptional == true)) {
          local_48 = (CharSetNode *)CONCAT44(local_48._4_4_,iVar24);
          pNVar5 = pAVar15->head;
          sVar19 = (pNVar5->firstSet->rep).compact.countPlusOne;
          iVar24 = (*pNVar5->_vptr_Node[0xb])(pNVar5,pCVar17);
          if (sVar19 == 2) {
            puVar16 = Compiler::Emit(pCVar17,7);
            cVar9 = CharSet<char16_t>::Singleton(pAVar15->head->firstSet);
            puVar21 = puVar16 + 3;
            CVar26 = itemSkipped;
            if ((char)iVar24 == '\0') {
              *puVar16 = '\x04';
              *(char16 *)(puVar16 + 1) = cVar9;
              puVar16[3] = 0xff;
              puVar16[4] = 0xff;
              puVar16[5] = 0xff;
              puVar16[6] = 0xff;
              puVar16 = pCVar17->instBuf;
              bVar8 = puVar16 < puVar21;
              bVar27 = puVar16 == puVar21;
LAB_00eb070c:
              iVar24 = (int)local_48;
              if ((!bVar8 && !bVar27) || (puVar16 + pCVar17->instNext <= puVar21)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                                   ,0x272,
                                   "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)"
                                   ,
                                   "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext"
                                  );
                if (!bVar8) goto LAB_00eb18ac;
                *puVar14 = 0;
                pCVar17 = local_38;
              }
              pCVar20 = (CharSetNode *)(ulong)(uint)((int)puVar21 - *(int *)&pCVar17->instBuf);
              goto LAB_00eb076e;
            }
            *puVar16 = '\x05';
            *(char16 *)(puVar16 + 1) = cVar9;
            puVar16[3] = 0xff;
            puVar16[4] = 0xff;
            puVar16[5] = 0xff;
            puVar16[6] = 0xff;
            puVar16 = pCVar17->instBuf;
            bVar8 = puVar16 < puVar21;
            bVar27 = puVar16 == puVar21;
          }
          else {
            puVar16 = Compiler::Emit(pCVar17,0x2d);
            this_00 = (RuntimeCharSet<char16_t> *)(puVar16 + 1);
            puVar21 = puVar16 + 0x29;
            if ((char)iVar24 == '\0') {
              *puVar16 = '\x06';
              RuntimeCharSet<char16_t>::RuntimeCharSet(this_00);
              puVar16[0x29] = 0xff;
              puVar16[0x2a] = 0xff;
              puVar16[0x2b] = 0xff;
              puVar16[0x2c] = 0xff;
              RuntimeCharSet<char16_t>::CloneFrom
                        (this_00,pCVar17->rtAllocator,pAVar15->head->firstSet);
              puVar16 = pCVar17->instBuf;
              bVar8 = puVar16 < puVar21;
              bVar27 = puVar16 == puVar21;
              CVar26 = itemSkipped;
              goto LAB_00eb070c;
            }
            *puVar16 = '\a';
            RuntimeCharSet<char16_t>::RuntimeCharSet(this_00);
            puVar16[0x29] = 0xff;
            puVar16[0x2a] = 0xff;
            puVar16[0x2b] = 0xff;
            puVar16[0x2c] = 0xff;
            RuntimeCharSet<char16_t>::CloneFrom
                      (this_00,pCVar17->rtAllocator,pAVar15->head->firstSet);
            puVar16 = pCVar17->instBuf;
            bVar8 = puVar16 < puVar21;
            bVar27 = puVar16 == puVar21;
            CVar26 = itemSkipped;
          }
          iVar24 = (int)local_48;
          if ((!bVar8 && !bVar27) || (puVar16 + pCVar17->instNext <= puVar21)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
            pCVar17 = local_38;
          }
          pCVar20 = (CharSetNode *)(ulong)(uint)((int)puVar21 - *(int *)&pCVar17->instBuf);
          local_60[0] = L'\x01';
          local_60[1] = L'\0';
        }
LAB_00eb076e:
        (*pAVar15->head->_vptr_Node[0x11])(pAVar15->head,pCVar17,local_60);
        if (iVar24 < (int)CVar26) {
          local_48 = pCVar20;
          puVar16 = Compiler::Emit(local_38,5);
          *puVar16 = '\x03';
          puVar16[1] = 0xff;
          puVar16[2] = 0xff;
          puVar16[3] = 0xff;
          puVar16[4] = 0xff;
          puVar16 = puVar16 + 1;
          if ((puVar16 < local_38->instBuf) || (local_38->instBuf + local_38->instNext <= puVar16))
          {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                               ,0x272,
                               "((uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext)",
                               "(uint8*)pLabel >= instBuf && (uint8*)pLabel < instBuf + instNext");
            if (!bVar8) goto LAB_00eb18ac;
            *puVar14 = 0;
          }
          *(int *)((long)local_50 + (long)iVar24 * 4) = (int)puVar16 - *(int *)&local_38->instBuf;
          pCVar20 = local_48;
          CVar26 = itemSkipped;
        }
        iVar24 = iVar24 + 1;
        pCVar17 = local_38;
      }
      pAVar15 = pAVar15->tail;
    } while (pAVar15 != (AltNode *)0x0);
    local_48 = pCVar20;
    if (0 < (int)CVar26) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar25 = 0;
      pCVar17 = local_38;
      do {
        uVar18 = *(uint *)((long)local_50 + uVar25 * 4);
        uVar12 = pCVar17->instNext;
        if (uVar12 <= uVar18) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x278,"(fixup < instNext)","fixup < instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        if (pCVar17->instNext < uVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                             ,0x279,"(label <= instNext)","label <= instNext");
          if (!bVar8) goto LAB_00eb18ac;
          *puVar14 = 0;
          pCVar17 = local_38;
        }
        *(uint *)(pCVar17->instBuf + uVar18) = uVar12;
        uVar25 = uVar25 + 1;
      } while (CVar26 != uVar25);
    }
    pCVar20 = local_48;
    if (local_40->isOptional == true) {
      uVar18 = pCVar17->instNext;
      if (uVar18 <= (uint)local_48) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x278,"(fixup < instNext)","fixup < instNext");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
      if (pCVar17->instNext < uVar18) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.h"
                           ,0x279,"(label <= instNext)","label <= instNext");
        if (!bVar8) goto LAB_00eb18ac;
        *puVar14 = 0;
        pCVar17 = local_38;
      }
      *(uint *)(pCVar17->instBuf + ((ulong)pCVar20 & 0xffffffff)) = uVar18;
    }
    break;
  case Set:
    sVar19 = (((local_40->super_Node).firstSet)->rep).compact.countPlusOne;
    if (local_40->isOptional == true) {
      if (sVar19 != 2) {
        puVar16 = Compiler::Emit(local_38,0x29);
        *puVar16 = '$';
LAB_00eb03d3:
        RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(puVar16 + 1));
        RuntimeCharSet<char16_t>::CloneFrom
                  ((RuntimeCharSet<char16_t> *)(puVar16 + 1),pCVar17->rtAllocator,
                   (local_40->super_Node).firstSet);
        return;
      }
      puVar16 = Compiler::Emit(local_38,3);
      cVar9 = CharSet<char16_t>::Singleton((local_40->super_Node).firstSet);
      *puVar16 = '#';
    }
    else {
      if (sVar19 != 2) {
        puVar16 = Compiler::Emit(local_38,0x29);
        *puVar16 = '\x1e';
        goto LAB_00eb03d3;
      }
      puVar16 = Compiler::Emit(local_38,3);
      cVar9 = CharSet<char16_t>::Singleton((local_40->super_Node).firstSet);
      *puVar16 = '\x1a';
    }
    *(char16 *)(puVar16 + 1) = cVar9;
  }
  return;
}

Assistant:

void AltNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);
        switch (scheme)
        {
            case Try:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Try((If|Match)(Char|Set))? L2
                    //          <item 1>
                    //          Jump Lexit
                    //   L2:    Try((If|Match)(Char|Set))? L3
                    //          <item 2>
                    //          Jump Lexit
                    //   L3:    <item 3>
                    //   Lexit:
                    //
                    Assert(!isOptional);
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                        numItems++;
                    Assert(numItems >= 1);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastTryFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail, item++)
                    {
                        if (item > 0)
                            // Fixup previous Try
                            compiler.DoFixup(lastTryFixup, compiler.CurrentLabel());
                        CharCount itemSkipped = 0;
                        if (item < numItems-1)
                        {
                            // HEURISTIC: if the first set of the alternative is exact or small, and the
                            //            alternative does not match empty, then it's probably worth using
                            //            a Try(If|Match)(Char|Set)
                            if (curr->head->firstSet != 0 &&
                                !curr->head->thisConsumes.CouldMatchEmpty() &&
                                (curr->head->isFirstExact || curr->head->firstSet->Count() <= maxCharsForConditionalTry))
                            {
                                if (curr->head->SupportsPrefixSkipping(compiler))
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                    itemSkipped = 1;
                                }
                                else
                                {
                                    if (curr->head->firstSet->IsSingleton())
                                        lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, curr->head->firstSet->Singleton())->failLabel);
                                    else
                                    {
                                        TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastTryFixup = compiler.GetFixup(&i->failLabel);
                                    }
                                }
                            }
                            else
                                lastTryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                        }
                        curr->head->Emit(compiler, itemSkipped);
                        if (item < numItems-1)
                            jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    // Fixup jumps
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    break;
                }
            case None:
                {
                    Assert(isOptional);
                    // Nothing to emit
                    break;
                }
            case Trie:
                {
                    //
                    // Compilation scheme:
                    //
                    //     MatchTrie <trie>
                    //
                    EMIT(compiler, MatchTrieInst)->trie = *runtimeTrie;
                    break;
                }
            case Switch:
                {
                    //
                    // Compilation scheme:
                    //
                    //            Switch(AndConsume)?(2|4|8|16|24)(<dispatch to each arm>)
                    //            Fail                                (if non-optional)
                    //            Jump Lexit                          (if optional)
                    //     L1:    <item1>
                    //            Jump Lexit
                    //     L2:    <item2>
                    //            Jump Lexit
                    //     L3:    <item3>
                    //     Lexit:
                    //
                    Assert(switchSize <= Switch24Inst::MaxCases);
                    int numItems = 0;
                    bool allCanSkip = true;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                        {
                            numItems++;
                            if (!curr->head->SupportsPrefixSkipping(compiler))
                            {
                                allCanSkip = false;
                            }
                        }
                    }
                    Assert(numItems > 1);

                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    // We must remember where each item begins to fixup switch
                    Label* caseLabels = AnewArray(compiler.ctAllocator, Label, numItems);
                    // We must fixup the switch arms
                    Label switchLabel = compiler.CurrentLabel();

                    Assert(switchSize <= Switch24Inst::MaxCases);
                    if (allCanSkip)
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, SwitchAndConsume24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }
                    else
                    {
                        if (switchSize <= Switch2Inst::MaxCases)
                        {
                            EMIT(compiler, Switch2Inst);
                        }
                        else if (switchSize <= Switch4Inst::MaxCases)
                        {
                            EMIT(compiler, Switch4Inst);
                        }
                        else if (switchSize <= Switch8Inst::MaxCases)
                        {
                            EMIT(compiler, Switch8Inst);
                        }
                        else if (switchSize <= Switch16Inst::MaxCases)
                        {
                            EMIT(compiler, Switch16Inst);
                        }
                        else if (switchSize <= Switch24Inst::MaxCases)
                        {
                            EMIT(compiler, Switch24Inst);
                        }
                        else
                        {
                            AssertOrFailFastMsg(false, "It should not be possible to reach here. This implies that we entered the Switch layout with greater than the max allowable cases.");
                        }
                    }

                    Label defaultJumpFixup = 0;
                    if (isOptional)
                    {
                        // Must fixup default jump to exit
                        defaultJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                    }
                    else
                    {
                        compiler.Emit<FailInst>();
                    }

                    // Emit each item
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (allCanSkip)
                            {
                                skipped = 1;
                            }
                            caseLabels[item] = compiler.CurrentLabel();
                            curr->head->Emit(compiler, skipped);
                            if (item < numItems - 1)
                            {
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            }
                            item++;
                        }
                    }

                    // Fixup exit labels
                    if (isOptional)
                    {
                        compiler.DoFixup(defaultJumpFixup, compiler.CurrentLabel());
                    }

                    for (item = 0; item < numItems - 1; item++)
                    {
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    }

                    // Fixup the switch entries
                    item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Char entries[CharSet<Char>::MaxCompact];
                            int count = curr->head->firstSet->GetCompactEntries(CharSet<Char>::MaxCompact, entries);
                            Assert(count > 0);
                            for (int i = 0; i < count; i++)
                            {
                                if (allCanSkip)
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(SwitchAndConsume24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                                else
                                {
                                    if (switchSize <= Switch2Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch2, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch4Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch4, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch8Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch8, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch16Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch16, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                    else if (switchSize <= Switch24Inst::MaxCases)
                                    {
                                        compiler.L2I(Switch24, switchLabel)->AddCase(entries[i], caseLabels[item]);
                                    }
                                }
                            }
                            item++;
                        }
                    }
                    break;
                }
            case Chain:
                {
                    //
                    // Compilation scheme:
                    //
                    //           JumpIfNot(Char|Set) L2
                    //           <item1>
                    //           Jump Lexit
                    //    L2:    JumpIfNot(Char|Set) L3
                    //           <item2>
                    //           Jump Lexit
                    //    L3:    <item3>                              (if non-optional)
                    //    L3:    JumpIfNot(Char|Set) Lexit            (if optional)
                    //           <item3>                              (if optional)
                    //    Lexit:
                    //
                    int numItems = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            Assert(isOptional);
                        }
                        else
                            numItems++;
                    }
                    Assert(numItems > 0);
                    // Each item other than last needs to jump to exit on success
                    Label* jumpFixups = AnewArray(compiler.ctAllocator, Label, (numItems - 1));
                    Label lastJumpFixup = 0;
                    int item = 0;
                    for (AltNode* curr = this; curr != 0; curr = curr->tail)
                    {
                        if (!curr->head->thisConsumes.CouldMatchEmpty())
                        {
                            if (item > 0)
                                // Fixup previous Jump
                                compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());

                            CharCount itemSkipped = 0;
                            if (item < numItems-1 || isOptional)
                            {
                                if (curr->head->firstSet->IsSingleton())
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, curr->head->firstSet->Singleton())->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                        lastJumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, curr->head->firstSet->Singleton())->targetLabel);
                                }
                                else
                                {
                                    if (curr->head->SupportsPrefixSkipping(compiler))
                                    {
                                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                        itemSkipped = 1;
                                    }
                                    else
                                    {
                                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                                        i->set.CloneFrom(compiler.rtAllocator, *curr->head->firstSet);
                                        lastJumpFixup = compiler.GetFixup(&i->targetLabel);
                                    }
                                }
                            }
                            curr->head->Emit(compiler, itemSkipped);
                            if (item < numItems-1)
                                jumpFixups[item] = compiler.GetFixup(&EMIT(compiler, JumpInst)->targetLabel);
                            item++;
                        }
                    }
                    // Fixup jumps to exit
                    for (item = 0; item < numItems-1; item++)
                        compiler.DoFixup(jumpFixups[item], compiler.CurrentLabel());
                    if (isOptional)
                        // Fixup last Jump to exit
                        compiler.DoFixup(lastJumpFixup, compiler.CurrentLabel());
                    break;
                }
            case Set:
                {
                    //
                    // Compilation scheme:
                    //
                    //          Match(Char|Set)    (non optional)
                    //          OptMatch(Char|Set) (optional)
                    //
                    if (isOptional)
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, OptMatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    else
                    {
                        if (firstSet->IsSingleton())
                            EMIT(compiler, MatchCharInst, firstSet->Singleton());
                        else
                            EMIT(compiler, MatchSetInst<false>)->set.CloneFrom(compiler.rtAllocator, *firstSet);
                    }
                    break;
                }
        }
    }